

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

bool slang::ast::AssertionExpr::checkAssertionCall
               (CallExpression *call,ASTContext *context,DiagCode outArgCode,DiagCode refArgCode,
               optional<slang::DiagCode> sysTaskCode,SourceRange range)

{
  SystemSubroutine *pSVar1;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar2;
  pointer ppEVar3;
  ulong uVar4;
  size_type sVar5;
  pointer ppFVar6;
  bool bVar7;
  uint uVar8;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar9;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar10;
  Symbol *pSVar11;
  Diagnostic *this;
  Diagnostic *this_00;
  SourceLocation noteLocation;
  ulong uVar12;
  long lVar13;
  
  if (*(__index_type *)
       ((long)&(call->subroutine).
               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
       + 0x30) == '\x01') {
    pvVar9 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       (&call->subroutine);
    pSVar1 = (pvVar9->subroutine).ptr;
    if (pSVar1 == (SystemSubroutine *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::SystemSubroutine *>::get() const [T = const slang::ast::SystemSubroutine *]"
                );
    }
    if (((uint6)sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                super__Optional_payload_base<slang::DiagCode> & 0x100000000) == 0 ||
        pSVar1->kind != Function) {
      if (pSVar1->hasOutputArgs != true) {
        return true;
      }
    }
    else {
      outArgCode = sysTaskCode.super__Optional_base<slang::DiagCode,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::DiagCode>._M_payload;
    }
    ASTContext::addDiag(context,outArgCode,range);
LAB_0039d916:
    bVar7 = false;
  }
  else {
    ppSVar10 = std::
               get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         (&call->subroutine);
    pSVar2 = *ppSVar10;
    ppEVar3 = (call->arguments_).data_;
    uVar4 = (call->arguments_).size_;
    if ((pSVar2->super_Scope).deferredMemberIndex != Invalid) {
      Scope::elaborate(&pSVar2->super_Scope);
    }
    sVar5 = (pSVar2->arguments).size_;
    if (sVar5 != 0) {
      ppFVar6 = (pSVar2->arguments).data_;
      lVar13 = sVar5 << 3;
      uVar12 = 0;
      do {
        if (ppFVar6[uVar12]->direction == Ref) {
          if (uVar4 <= uVar12) {
            assert::assertFailed
                      ("index < args.size()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssertionExpr.cpp"
                       ,0x11e,
                       "static bool slang::ast::AssertionExpr::checkAssertionCall(const CallExpression &, const ASTContext &, DiagCode, DiagCode, std::optional<DiagCode>, SourceRange)"
                      );
          }
          pSVar11 = Expression::getSymbolReference(ppEVar3[uVar12],true);
          if ((((pSVar11 != (Symbol *)0x0) && (uVar8 = pSVar11->kind - Variable, uVar8 < 0x19)) &&
              ((0x1800c0fU >> (uVar8 & 0x1f) & 1) != 0)) && ((int)pSVar11[2].name._M_len == 0)) {
            this = ASTContext::addDiag(context,refArgCode,ppEVar3[uVar12]->sourceRange);
            this_00 = Diagnostic::operator<<(this,pSVar11->name);
            Diagnostic::operator<<
                      (this_00,(ppFVar6[uVar12]->super_VariableSymbol).super_ValueSymbol.
                               super_Symbol.name);
            noteLocation = pSVar11->location;
            goto LAB_0039d90c;
          }
        }
        else if (ppFVar6[uVar12]->direction - Out < 2) {
          this = ASTContext::addDiag(context,outArgCode,range);
          noteLocation = (ppFVar6[uVar12]->super_VariableSymbol).super_ValueSymbol.super_Symbol.
                         location;
LAB_0039d90c:
          Diagnostic::addNote(this,(DiagCode)0x40001,noteLocation);
          goto LAB_0039d916;
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + -8;
      } while (lVar13 != 0);
    }
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool AssertionExpr::checkAssertionCall(const CallExpression& call, const ASTContext& context,
                                       DiagCode outArgCode, DiagCode refArgCode,
                                       std::optional<DiagCode> sysTaskCode, SourceRange range) {
    if (call.isSystemCall()) {
        auto& sub = *std::get<1>(call.subroutine).subroutine;
        if (sub.kind == SubroutineKind::Function && sysTaskCode) {
            context.addDiag(*sysTaskCode, range);
            return false;
        }

        if (sub.hasOutputArgs) {
            context.addDiag(outArgCode, range);
            return false;
        }
    }
    else {
        auto& sub = *std::get<0>(call.subroutine);
        auto args = call.arguments();
        size_t index = 0;
        for (auto& formal : sub.getArguments()) {
            if (formal->direction == ArgumentDirection::Out ||
                formal->direction == ArgumentDirection::InOut) {
                auto& diag = context.addDiag(outArgCode, range);
                diag.addNote(diag::NoteDeclarationHere, formal->location);
                return false;
            }

            if (formal->direction == ArgumentDirection::Ref) {
                ASSERT(index < args.size());
                if (auto sym = args[index]->getSymbolReference()) {
                    if (VariableSymbol::isKind(sym->kind) &&
                        sym->as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                        auto& diag = context.addDiag(refArgCode, args[index]->sourceRange);
                        diag << sym->name << formal->name;
                        diag.addNote(diag::NoteDeclarationHere, sym->location);
                        return false;
                    }
                }
            }

            index++;
        }
    }

    return true;
}